

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_util.c
# Opt level: O1

void find_mismatch_plane(aom_image_t *img1,aom_image_t *img2,int plane,int use_highbitdepth,int *loc
                        )

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  int local_ec;
  int local_e8;
  int si;
  
  iVar22 = img1->stride[(uint)plane] >> ((byte)use_highbitdepth & 0x1f);
  iVar23 = img2->stride[(uint)plane] >> ((byte)use_highbitdepth & 0x1f);
  uVar5 = 0x40;
  uVar24 = 0x40;
  if (plane != 0) {
    uVar24 = 0x40 >> ((byte)img1->x_chroma_shift & 0x1f);
    uVar5 = 0x40 >> ((byte)img1->y_chroma_shift & 0x1f);
  }
  uVar26 = img1->d_w;
  if (plane != 0) {
    uVar26 = uVar26 + img1->x_chroma_shift >> ((byte)img1->x_chroma_shift & 0x1f);
  }
  uVar8 = img1->d_h;
  if (plane != 0) {
    uVar8 = uVar8 + img1->y_chroma_shift >> ((byte)img1->y_chroma_shift & 0x1f);
  }
  puVar2 = img1->planes[(uint)plane];
  puVar3 = img2->planes[(uint)plane];
  *loc = -1;
  loc[1] = -1;
  loc[2] = -1;
  loc[3] = -1;
  if (((img1->monochrome == 0) || (plane == 0 || img2->monochrome == 0)) && (uVar8 != 0)) {
    iVar16 = 0;
    iVar17 = 0;
    iVar21 = 0;
    iVar29 = 0;
    uVar28 = 0;
    do {
      if (uVar26 == 0) {
        bVar31 = true;
      }
      else {
        uVar11 = uVar28 + uVar5;
        uVar9 = uVar8 - uVar28;
        if (uVar11 < uVar8 - uVar28) {
          uVar9 = uVar11;
        }
        if (uVar8 <= uVar11) {
          uVar11 = uVar8;
        }
        uVar11 = uVar11 - uVar28;
        if (plane != 0) {
          uVar11 = uVar9;
        }
        local_ec = iVar21;
        local_e8 = iVar16;
        iVar4 = iVar29;
        iVar1 = iVar17;
        uVar9 = 0;
        do {
          uVar6 = uVar9 + uVar24;
          if (plane == 0) {
            uVar14 = uVar26;
            if (uVar6 < uVar26) {
              uVar14 = uVar6;
            }
            uVar14 = uVar14 - uVar9;
          }
          else {
            uVar14 = uVar26 - uVar9;
            if (uVar6 < uVar26 - uVar9) {
              uVar14 = uVar6;
            }
          }
          if ((int)uVar11 < 1) {
            bVar31 = true;
          }
          else {
            iVar15 = 0;
            iVar13 = local_e8;
            iVar20 = local_ec;
            iVar27 = iVar1;
            iVar25 = iVar4;
            do {
              if ((int)uVar14 < 1) {
                bVar31 = true;
              }
              else {
                lVar30 = 2;
                iVar12 = iVar13;
                iVar19 = iVar20;
                uVar10 = uVar9;
                do {
                  if (use_highbitdepth == 0) {
                    uVar18 = (uint)puVar2[iVar19];
                    uVar7 = (uint)puVar3[iVar12];
                  }
                  else {
                    uVar18 = (uint)*(ushort *)(puVar2 + (iVar25 + (int)lVar30 + -2));
                    uVar7 = (uint)*(ushort *)(puVar3 + (iVar27 + (int)lVar30 + -2));
                  }
                  bVar31 = uVar18 == uVar7;
                  if (!bVar31) {
                    *loc = iVar15 + uVar28;
                    loc[1] = uVar10;
                    loc[2] = uVar18;
                    loc[3] = uVar7;
                    break;
                  }
                  iVar19 = iVar19 + 1;
                  iVar12 = iVar12 + 1;
                  uVar10 = uVar10 + 1;
                  bVar32 = (ulong)uVar14 * 2 != lVar30;
                  lVar30 = lVar30 + 2;
                } while (bVar32);
              }
              if (!bVar31) break;
              iVar15 = iVar15 + 1;
              iVar25 = iVar25 + iVar22 * 2;
              iVar20 = iVar20 + iVar22;
              iVar27 = iVar27 + iVar23 * 2;
              iVar13 = iVar13 + iVar23;
            } while (iVar15 < (int)uVar11);
          }
          if (!bVar31) break;
          iVar4 = iVar4 + uVar24 * 2;
          local_ec = local_ec + uVar24;
          iVar1 = iVar1 + uVar24 * 2;
          local_e8 = local_e8 + uVar24;
          uVar9 = uVar6;
        } while (uVar6 < uVar26);
      }
      if (!bVar31) {
        return;
      }
      uVar28 = uVar28 + uVar5;
      iVar29 = iVar29 + uVar5 * iVar22 * 2;
      iVar21 = iVar21 + uVar5 * iVar22;
      iVar17 = iVar17 + uVar5 * iVar23 * 2;
      iVar16 = iVar16 + uVar5 * iVar23;
    } while (uVar28 < uVar8);
  }
  return;
}

Assistant:

static void find_mismatch_plane(const aom_image_t *const img1,
                                const aom_image_t *const img2, int plane,
                                int use_highbitdepth, int loc[4]) {
  const unsigned char *const p1 = img1->planes[plane];
  const int p1_stride = img1->stride[plane] >> use_highbitdepth;
  const unsigned char *const p2 = img2->planes[plane];
  const int p2_stride = img2->stride[plane] >> use_highbitdepth;
  const uint32_t bsize = 64;
  const int is_y_plane = (plane == AOM_PLANE_Y);
  const uint32_t bsizex = is_y_plane ? bsize : bsize >> img1->x_chroma_shift;
  const uint32_t bsizey = is_y_plane ? bsize : bsize >> img1->y_chroma_shift;
  const uint32_t c_w =
      is_y_plane ? img1->d_w
                 : (img1->d_w + img1->x_chroma_shift) >> img1->x_chroma_shift;
  const uint32_t c_h =
      is_y_plane ? img1->d_h
                 : (img1->d_h + img1->y_chroma_shift) >> img1->y_chroma_shift;
  assert(img1->d_w == img2->d_w && img1->d_h == img2->d_h);
  assert(img1->x_chroma_shift == img2->x_chroma_shift &&
         img1->y_chroma_shift == img2->y_chroma_shift);
  loc[0] = loc[1] = loc[2] = loc[3] = -1;
  if (img1->monochrome && img2->monochrome && plane) return;
  int match = 1;
  uint32_t i, j;
  for (i = 0; match && i < c_h; i += bsizey) {
    for (j = 0; match && j < c_w; j += bsizex) {
      const int si =
          is_y_plane ? mmin(i + bsizey, c_h) - i : mmin(i + bsizey, c_h - i);
      const int sj =
          is_y_plane ? mmin(j + bsizex, c_w) - j : mmin(j + bsizex, c_w - j);
      int k, l;
      for (k = 0; match && k < si; ++k) {
        for (l = 0; match && l < sj; ++l) {
          const int row = i + k;
          const int col = j + l;
          const int offset1 = row * p1_stride + col;
          const int offset2 = row * p2_stride + col;
          const int val1 = use_highbitdepth
                               ? p1[2 * offset1] | (p1[2 * offset1 + 1] << 8)
                               : p1[offset1];
          const int val2 = use_highbitdepth
                               ? p2[2 * offset2] | (p2[2 * offset2 + 1] << 8)
                               : p2[offset2];
          if (val1 != val2) {
            loc[0] = row;
            loc[1] = col;
            loc[2] = val1;
            loc[3] = val2;
            match = 0;
            break;
          }
        }
      }
    }
  }
}